

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void __thiscall
Js::ScriptFunctionWithInlineCache::AllocateInlineCache(ScriptFunctionWithInlineCache *this)

{
  Type *addr;
  Type TVar1;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  PropertyId PVar5;
  undefined4 *puVar6;
  FunctionBody *this_01;
  FunctionBody *this_02;
  ScriptContext *pSVar7;
  Recycler *pRVar8;
  void **ppvVar9;
  uchar *puVar10;
  void *pvVar11;
  RootObjectBase *this_03;
  PropertyRecord *pPVar12;
  InlineCache *pIVar13;
  uint uVar14;
  void **ppvVar15;
  Type *addr_00;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong size;
  ulong uVar19;
  long lVar20;
  undefined1 local_98 [8];
  TrackAllocData data;
  
  if ((this->m_inlineCaches).ptr != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x2d8,"(this->m_inlineCaches == nullptr)",
                                "this->m_inlineCaches == nullptr");
    if (!bVar3) goto LAB_00d4906a;
    *puVar6 = 0;
  }
  uVar14 = this->inlineCacheCount;
  TVar1 = this->isInstInlineCacheCount;
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
  uVar16 = TVar1 + uVar14;
  if (uVar16 != 0) {
    this_02 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
    pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this_02);
    size = (ulong)uVar16;
    local_98 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8d953b6;
    data.filename._0_4_ = 0x2e2;
    data.plusSize = size;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pSVar7->recycler,(TrackAllocData *)local_98);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d4906a;
      *puVar6 = 0;
    }
    data._32_8_ = (ulong)uVar16;
    ppvVar9 = (void **)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                                 (pRVar8,size * 8);
    if (ppvVar9 == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00d4906a;
      *puVar6 = 0;
    }
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8d953b6;
    data.filename._0_4_ = 0x2e5;
    data.plusSize = size;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pSVar7->recycler,(TrackAllocData *)local_98);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d4906a;
      *puVar6 = 0;
    }
    puVar10 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar8,size);
    if (puVar10 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00d4906a;
      *puVar6 = 0;
    }
    addr = &this->m_inlineCacheTypes;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->m_inlineCacheTypes).ptr = puVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    uVar16 = this->rootObjectLoadInlineCacheStart;
    uVar18 = (ulong)uVar16;
    if (uVar18 != 0) {
      uVar19 = 0;
      do {
        pvVar11 = new<Memory::InlineCacheAllocator>(0x20,&pSVar7->inlineCacheAllocator,0x776e3e);
        ppvVar9[uVar19] = pvVar11;
        uVar19 = uVar19 + 1;
      } while (uVar18 != uVar19);
    }
    this_03 = FunctionBody::GetRootObject(this_01);
    this_00 = pSVar7->threadContext;
    uVar17 = this->rootObjectLoadMethodInlineCacheStart;
    if (uVar16 < uVar17) {
      ppvVar15 = ppvVar9 + uVar18;
      do {
        PVar5 = FunctionBody::GetPropertyIdFromCacheId(this_01,(uint)uVar18);
        pPVar12 = ThreadContext::GetPropertyName(this_00,PVar5);
        pIVar13 = RootObjectBase::GetInlineCache(this_03,pPVar12,false,false);
        *ppvVar15 = pIVar13;
        ppvVar15 = ppvVar15 + 1;
        uVar16 = (uint)uVar18 + 1;
        uVar18 = (ulong)uVar16;
      } while (uVar17 != uVar16);
      uVar18 = (ulong)uVar17;
    }
    uVar16 = this->rootObjectStoreInlineCacheStart;
    uVar19 = uVar18;
    if ((uint)uVar18 < uVar16) {
      ppvVar15 = ppvVar9 + uVar18;
      do {
        PVar5 = FunctionBody::GetPropertyIdFromCacheId(this_01,(uint)uVar18);
        pPVar12 = ThreadContext::GetPropertyName(this_00,PVar5);
        pIVar13 = RootObjectBase::GetInlineCache(this_03,pPVar12,true,false);
        *ppvVar15 = pIVar13;
        ppvVar15 = ppvVar15 + 1;
        uVar17 = (uint)uVar18 + 1;
        uVar18 = (ulong)uVar17;
        uVar19 = (ulong)uVar16;
      } while (uVar16 != uVar17);
    }
    uVar16 = (uint)uVar19;
    if ((uint)uVar19 < uVar14) {
      ppvVar15 = ppvVar9 + uVar19;
      do {
        PVar5 = FunctionBody::GetPropertyIdFromCacheId(this_01,(uint)uVar19);
        pPVar12 = ThreadContext::GetPropertyName(this_00,PVar5);
        pIVar13 = RootObjectBase::GetInlineCache(this_03,pPVar12,false,true);
        *ppvVar15 = pIVar13;
        ppvVar15 = ppvVar15 + 1;
        uVar17 = (uint)uVar19 + 1;
        uVar19 = (ulong)uVar17;
        uVar16 = uVar14;
      } while (uVar14 != uVar17);
    }
    uVar14 = data.line;
    if (uVar16 < uVar14) {
      lVar20 = 0;
      do {
        pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
        pvVar11 = new<Memory::CacheAllocator>(0x20,&pSVar7->isInstInlineCacheAllocator,0x776d48);
        ppvVar9[(ulong)uVar16 + lVar20] = pvVar11;
        lVar20 = lVar20 + 1;
      } while (uVar14 - uVar16 != (int)lVar20);
    }
    pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_8d953b6;
    data.filename._0_4_ = 0x30e;
    data.plusSize = size;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pSVar7->recycler,(TrackAllocData *)local_98);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d4906a;
      *puVar6 = 0;
    }
    puVar10 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar8,size);
    if (puVar10 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00d4906a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    addr_00 = &this->m_inlineCaches;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = puVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    Memory::Recycler::WBSetBit((char *)addr_00);
    addr_00->ptr = ppvVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  }
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::AllocateInlineCache()
    {
        Assert(this->m_inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + isInstInlineCacheCount;
        Js::FunctionBody* functionBody = this->GetFunctionBody();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            Js::ScriptContext* scriptContext = this->GetFunctionBody()->GetScriptContext();
            void ** inlineCaches = RecyclerNewArrayZ(scriptContext->GetRecycler() ,
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = rootObjectLoadInlineCacheStart;
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = functionBody->GetRootObject();
            ThreadContext * threadContext = scriptContext->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = rootObjectLoadMethodInlineCacheStart;
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = rootObjectStoreInlineCacheStart;
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    functionBody->GetScriptContext()->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(functionBody->GetScriptContext()->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->m_inlineCaches = inlineCaches;
        }
    }